

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

void __thiscall
QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache(QOpenGLProgramBinaryCache *this)

{
  bool bVar1;
  char *pcVar2;
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry> *in_RDI;
  long in_FS_OFFSET;
  QString sharedCachePath;
  QString subPath;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *in_stack_fffffffffffffe68;
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry> *a;
  QMessageLogger *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe88;
  char local_168 [32];
  undefined1 local_148 [80];
  QStringBuilder<const_QString_&,_const_QString_&> local_f8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined2 local_b2;
  QLatin1StringView local_98;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  QString::QString((QString *)0x90fd30);
  QString::QString((QString *)0x90fd3e);
  QString::QString((QString *)0x90fd4c);
  *(undefined1 *)&in_RDI[1].chain.prev = 0;
  QCache<QByteArray,_QOpenGLProgramBinaryCache::MemCacheEntry>::QCache
            (in_RDI,(qsizetype)in_stack_fffffffffffffe68);
  QMutex::QMutex((QMutex *)0x90fd74);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = Qt::Literals::StringLiterals::operator____L1((char *)a,(size_t)in_RDI);
  QSysInfo::buildAbi();
  ::operator+((QLatin1String *)a,(QString *)in_RDI);
  local_b2 = 0x2f;
  ::operator+((QStringBuilder<QLatin1String,_QString> *)a,(char16_t *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe68);
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x90fe35);
  QStringBuilder<QLatin1String,_QString>::~QStringBuilder
            ((QStringBuilder<QLatin1String,_QString> *)0x90fe42);
  QString::~QString((QString *)0x90fe4f);
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QStandardPaths::writableLocation((StandardLocation)&local_d0);
  local_f8 = ::operator+((QString *)in_RDI,(QString *)in_stack_fffffffffffffe68);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<const_QString_&,_const_QString_&> *)in_stack_fffffffffffffe68);
  QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe68);
  QString::~QString((QString *)0x90fee7);
  QStandardPaths::writableLocation((StandardLocation)local_148);
  ::operator+((QString *)a,(QString *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString,_const_QString_&> *)in_stack_fffffffffffffe68);
  QString::operator=((QString *)in_RDI,(QString *)in_stack_fffffffffffffe68);
  QString::~QString((QString *)0x90ff42);
  QStringBuilder<QString,_const_QString_&>::~QStringBuilder
            ((QStringBuilder<QString,_const_QString_&> *)0x90ff4c);
  QString::~QString((QString *)0x90ff56);
  bVar1 = QString::isEmpty((QString *)0x90ff63);
  if (!bVar1) {
    QString::operator=((QString *)&(in_RDI->d).spans,(QString *)in_RDI);
    bVar1 = qt_ensureWritableDir((QString *)in_stack_fffffffffffffe80);
    *(bool *)&in_RDI[1].chain.prev = bVar1;
  }
  if (((ulong)in_RDI[1].chain.prev & 1) == 0) {
    QString::operator=((QString *)&(in_RDI->d).spans,(QString *)&(in_RDI->d).size);
    bVar1 = qt_ensureWritableDir((QString *)in_stack_fffffffffffffe80);
    *(bool *)&in_RDI[1].chain.prev = bVar1;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = 0xaa;
  uStack_3f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
             (QLoggingCategory *)in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_48);
    if (!bVar1) break;
    anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x910024);
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe80,(char *)a,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_fffffffffffffe68,(char *)0x91003a);
    QtPrivate::asString((QString *)&(in_RDI->d).spans);
    QString::toLocal8Bit(in_stack_fffffffffffffe88);
    pcVar2 = QByteArray::constData((QByteArray *)0x91005f);
    QMessageLogger::debug
              (local_168,"Cache location \'%s\' writable = %d",pcVar2,
               (ulong)(*(byte *)&in_RDI[1].chain.prev & 1));
    QByteArray::~QByteArray((QByteArray *)0x91008c);
    local_40 = 0;
  }
  QString::~QString((QString *)0x9100a6);
  QString::~QString((QString *)0x9100b3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLProgramBinaryCache::QOpenGLProgramBinaryCache()
    : m_cacheWritable(false)
{
    const QString subPath = "/qtshadercache-"_L1 + QSysInfo::buildAbi() + u'/';
    const QString sharedCachePath = QStandardPaths::writableLocation(QStandardPaths::GenericCacheLocation);
    m_globalCacheDir = sharedCachePath + subPath;
    m_localCacheDir = QStandardPaths::writableLocation(QStandardPaths::CacheLocation) + subPath;

    if (!sharedCachePath.isEmpty()) {
        m_currentCacheDir = m_globalCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }
    if (!m_cacheWritable) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
    }

    qCDebug(lcOpenGLProgramDiskCache, "Cache location '%s' writable = %d", qPrintable(m_currentCacheDir), m_cacheWritable);
}